

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exported_table_data.cpp
# Opt level: O1

void __thiscall
duckdb::ExportedTableInfo::ExportedTableInfo
          (ExportedTableInfo *this,ClientContext *context,ExportedTableData *table_data_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_20;
  
  local_20 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                       (context,&table_data_p->database_name,&table_data_p->schema_name,
                        &table_data_p->table_name,THROW_EXCEPTION,
                        (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_20);
  this->entry = local_20.ptr;
  paVar1 = &(this->table_data).table_name.field_2;
  (this->table_data).table_name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (table_data_p->table_name)._M_dataplus._M_p;
  paVar2 = &(table_data_p->table_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(table_data_p->table_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table_data).table_name.field_2 + 8) = uVar4;
  }
  else {
    (this->table_data).table_name._M_dataplus._M_p = pcVar3;
    (this->table_data).table_name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->table_data).table_name._M_string_length = (table_data_p->table_name)._M_string_length;
  (table_data_p->table_name)._M_dataplus._M_p = (pointer)paVar2;
  (table_data_p->table_name)._M_string_length = 0;
  (table_data_p->table_name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->table_data).schema_name.field_2;
  (this->table_data).schema_name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (table_data_p->schema_name)._M_dataplus._M_p;
  paVar2 = &(table_data_p->schema_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(table_data_p->schema_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table_data).schema_name.field_2 + 8) = uVar4;
  }
  else {
    (this->table_data).schema_name._M_dataplus._M_p = pcVar3;
    (this->table_data).schema_name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->table_data).schema_name._M_string_length = (table_data_p->schema_name)._M_string_length;
  (table_data_p->schema_name)._M_dataplus._M_p = (pointer)paVar2;
  (table_data_p->schema_name)._M_string_length = 0;
  (table_data_p->schema_name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->table_data).database_name.field_2;
  (this->table_data).database_name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (table_data_p->database_name)._M_dataplus._M_p;
  paVar2 = &(table_data_p->database_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(table_data_p->database_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table_data).database_name.field_2 + 8) = uVar4;
  }
  else {
    (this->table_data).database_name._M_dataplus._M_p = pcVar3;
    (this->table_data).database_name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->table_data).database_name._M_string_length = (table_data_p->database_name)._M_string_length
  ;
  (table_data_p->database_name)._M_dataplus._M_p = (pointer)paVar2;
  (table_data_p->database_name)._M_string_length = 0;
  (table_data_p->database_name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->table_data).file_path.field_2;
  (this->table_data).file_path._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (table_data_p->file_path)._M_dataplus._M_p;
  paVar2 = &(table_data_p->file_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(table_data_p->file_path).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table_data).file_path.field_2 + 8) = uVar4;
  }
  else {
    (this->table_data).file_path._M_dataplus._M_p = pcVar3;
    (this->table_data).file_path.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->table_data).file_path._M_string_length = (table_data_p->file_path)._M_string_length;
  (table_data_p->file_path)._M_dataplus._M_p = (pointer)paVar2;
  (table_data_p->file_path)._M_string_length = 0;
  (table_data_p->file_path).field_2._M_local_buf[0] = '\0';
  pbVar5 = (table_data_p->not_null_columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->table_data).not_null_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (table_data_p->not_null_columns).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->table_data).not_null_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->table_data).not_null_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (table_data_p->not_null_columns).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (table_data_p->not_null_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (table_data_p->not_null_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (table_data_p->not_null_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

ExportedTableInfo::ExportedTableInfo(ClientContext &context, ExportedTableData table_data_p)
    : entry(GetEntry(context, table_data_p)), table_data(std::move(table_data_p)) {
}